

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmTarget * __thiscall
cmMakefile::AddCustomCommandToTarget
          (cmMakefile *this,string *target,cmCustomCommandType type,
          unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc)

{
  bool bVar1;
  PolicyStatus cmp0116;
  pointer pcVar2;
  anon_class_24_3_6b4d0599 local_60;
  cmTarget *local_48;
  cmTarget *t;
  cmCustomCommandLines *commandLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *byproducts;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc_local;
  string *psStack_20;
  cmCustomCommandType type_local;
  string *target_local;
  cmMakefile *this_local;
  
  byproducts = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)cc;
  cc_local._4_4_ = type;
  psStack_20 = target;
  target_local = (string *)this;
  pcVar2 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc);
  commandLines = (cmCustomCommandLines *)cmCustomCommand::GetByproducts_abi_cxx11_(pcVar2);
  pcVar2 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc);
  t = (cmTarget *)cmCustomCommand::GetCommandLines(pcVar2);
  local_48 = GetCustomCommandTarget(this,psStack_20,Reject,&this->Backtrace);
  if ((local_48 != (cmTarget *)0x0) &&
     (bVar1 = ValidateCustomCommand(this,(cmCustomCommandLines *)t), bVar1)) {
    CreateGeneratedOutputs
              (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)commandLines);
    pcVar2 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc)
    ;
    cmp0116 = GetPolicyStatus(this,CMP0116,false);
    cmCustomCommand::SetCMP0116Status(pcVar2,cmp0116);
    local_60.t = local_48;
    local_60.type = cc_local._4_4_;
    local_60.this = this;
    AddGeneratorAction<std::unique_ptr<cmCustomCommand,std::default_delete<cmCustomCommand>>,cmMakefile::AddCustomCommandToTarget(std::__cxx11::string_const&,cmCustomCommandType,std::unique_ptr<cmCustomCommand,std::default_delete<cmCustomCommand>>)::__0>
              (this,cc,&local_60);
    return local_48;
  }
  return local_48;
}

Assistant:

cmTarget* cmMakefile::AddCustomCommandToTarget(
  const std::string& target, cmCustomCommandType type,
  std::unique_ptr<cmCustomCommand> cc)
{
  const auto& byproducts = cc->GetByproducts();
  const auto& commandLines = cc->GetCommandLines();

  cmTarget* t = this->GetCustomCommandTarget(
    target, cmObjectLibraryCommands::Reject, this->Backtrace);

  // Validate custom commands.
  if (!t || !this->ValidateCustomCommand(commandLines)) {
    return t;
  }

  // Always create the byproduct sources and mark them generated.
  this->CreateGeneratedOutputs(byproducts);

  cc->SetCMP0116Status(this->GetPolicyStatus(cmPolicies::CMP0116));

  // Dispatch command creation to allow generator expressions in outputs.
  this->AddGeneratorAction(
    std::move(cc),
    [=](cmLocalGenerator& lg, const cmListFileBacktrace& lfbt,
        std::unique_ptr<cmCustomCommand> tcc) {
      BacktraceGuard guard(this->Backtrace, lfbt);
      tcc->SetBacktrace(lfbt);
      detail::AddCustomCommandToTarget(lg, cmCommandOrigin::Project, t, type,
                                       std::move(tcc));
    });

  return t;
}